

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfStatement.cpp
# Opt level: O0

string * __thiscall
ninx::parser::element::IfStatement::dump_abi_cxx11_
          (string *__return_storage_ptr__,IfStatement *this,int level)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  pointer pIVar4;
  pointer pBVar5;
  allocator local_2e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string local_2a8 [39];
  allocator local_281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240 [32];
  reference local_220;
  unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_> *c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  *__range1;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [380];
  int local_1c;
  IfStatement *pIStack_18;
  int level_local;
  IfStatement *this_local;
  
  local_1c = level;
  pIStack_18 = this;
  this_local = (IfStatement *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  uVar2 = (ulong)local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,uVar2,'\t',&local_1e9);
  std::operator+(&local_1c8,&local_1e8,"IfStatement {");
  poVar3 = std::operator<<(local_198,(string *)&local_1c8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  __end1 = std::
           vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
           ::begin(&this->cases);
  c = (unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>
       *)std::
         vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
         ::end(&this->cases);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>_>
                                     *)&c), bVar1) {
    local_220 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>_>
                ::operator*(&__end1);
    pIVar4 = std::
             unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>
             ::operator->(local_220);
    (*(pIVar4->super_ASTElement)._vptr_ASTElement[3])(local_240,pIVar4,(ulong)(local_1c + 1));
    poVar3 = std::operator<<(local_198,local_240);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_240);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->else_body);
  if (bVar1) {
    uVar2 = (ulong)local_1c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_280,uVar2,'\t',&local_281);
    std::operator+(&local_260,&local_280,"} Else {");
    poVar3 = std::operator<<(local_198,(string *)&local_260);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
    pBVar5 = std::
             unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
             ::operator->(&this->else_body);
    (*(pBVar5->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[3])
              (local_2a8,pBVar5,(ulong)(local_1c + 1));
    poVar3 = std::operator<<(local_198,local_2a8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_2a8);
  }
  uVar2 = (ulong)local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e8,uVar2,'\t',&local_2e9);
  std::operator+(&local_2c8,&local_2e8,"}");
  poVar3 = std::operator<<(local_198,(string *)&local_2c8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::IfStatement::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "IfStatement {" << std::endl;
    for (auto& c : cases) {
        s << c->dump(level+1) << std::endl;
    }
    if (this->else_body) {
        s << std::string(level, '\t') + "} Else {" << std::endl;
        s << this->else_body->dump(level+1) << std::endl;
    }
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}